

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

void __thiscall toml::syntax_error::~syntax_error(syntax_error *this)

{
  syntax_error *in_RDI;
  
  ~syntax_error(in_RDI);
  operator_delete(in_RDI,0x40);
  return;
}

Assistant:

~syntax_error() noexcept override = default;